

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.cpp
# Opt level: O2

void rsa_debug(mbedtls_pk_context *pk,mbedtls_pk_debug_item *items)

{
  void *pvVar1;
  
  pvVar1 = pk->pk_ctx;
  items->type = MBEDTLS_PK_DEBUG_MPI;
  items->name = "rsa.N";
  items->value = (void *)((long)pvVar1 + 0x10);
  items[1].type = MBEDTLS_PK_DEBUG_MPI;
  items[1].name = "rsa.E";
  items[1].value = (void *)((long)pvVar1 + 0x20);
  return;
}

Assistant:

static void rsa_debug(mbedtls_pk_context *pk, mbedtls_pk_debug_item *items)
{
#if defined(MBEDTLS_RSA_ALT)
    /* Not supported */
    (void) pk;
    (void) items;
#else
    mbedtls_rsa_context *rsa = (mbedtls_rsa_context *) pk->pk_ctx;

    items->type = MBEDTLS_PK_DEBUG_MPI;
    items->name = "rsa.N";
    items->value = &(rsa->N);

    items++;

    items->type = MBEDTLS_PK_DEBUG_MPI;
    items->name = "rsa.E";
    items->value = &(rsa->E);
#endif
}